

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::recordCommandBufferFinalize(CLIntercept *this,cl_command_buffer_khr cmdbuf)

{
  mapped_type *this_00;
  cl_command_buffer_khr local_20;
  
  local_20 = cmdbuf;
  std::mutex::lock(&this->m_Mutex);
  this_00 = std::
            map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
            ::operator[](&this->m_CommandBufferRecordMap,&local_20);
  SCommandBufferRecord::recordFinalize(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::recordCommandBufferFinalize(
    cl_command_buffer_khr cmdbuf )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    SCommandBufferRecord& recording = m_CommandBufferRecordMap[ cmdbuf ];
    recording.recordFinalize();
}